

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int moveto_snode(lyxp_set *set,lys_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  ly_ctx *ctx;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  lys_module *moveto_mod;
  lys_module *module;
  lys_node *plVar4;
  lys_node *last;
  undefined6 in_register_0000000a;
  ulong uVar5;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  lyxp_node_type local_44;
  uint local_40;
  lyxp_node_type root_type;
  ulong local_38;
  ulong uVar6;
  
  if (set->type == LYXP_SET_EMPTY) {
    return 0;
  }
  root_type = options;
  if (set->type == LYXP_SET_SNODE_SET) {
    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node,options,&local_44);
    local_38 = CONCAT44(local_38._4_4_,(int)CONCAT62(in_register_0000000a,qname_len));
    pcVar3 = strnchr(qname,0x3a,(uint)qname_len);
    bVar1 = false;
    if (pcVar3 == (char *)0x0) {
      moveto_mod = (lys_module *)0x0;
      uVar8 = (uint)local_38;
    }
    else {
      uVar8 = (int)pcVar3 - (int)qname;
      moveto_mod = moveto_resolve_model(qname,(uint16_t)uVar8,ctx,cur_node,options);
      if (moveto_mod == (lys_module *)0x0) {
        ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar8,qname);
        goto LAB_001679ee;
      }
      qname = qname + (long)(int)uVar8 + 1;
      uVar8 = ~uVar8 + (uint)local_38;
    }
    pcVar3 = lydict_insert(ctx,qname,(ulong)(uVar8 & 0xffff));
    local_40 = set->used;
    uVar9 = 0;
    if (0 < (int)local_40) {
      uVar9 = (ulong)local_40;
    }
    uVar5 = 0;
    while (uVar5 != uVar9) {
      uVar6 = uVar5;
      if ((set->val).nodes[uVar5].pos == 1) {
        (set->val).nodes[uVar5].pos = 0;
        if ((set->val).nodes[uVar5].type < LYXP_NODE_ELEM) {
          plVar4 = (lys_node *)0x0;
          local_38 = uVar5;
          while( true ) {
            module = moveto_mod;
            if (moveto_mod == (lys_module *)0x0) {
              module = lys_node_module((lys_node *)(set->val).nodes[uVar5].node);
            }
            plVar4 = lys_getnext(plVar4,(lys_node *)0x0,module,0);
            uVar6 = local_38;
            if (plVar4 == (lys_node *)0x0) break;
            iVar2 = moveto_snode_check(plVar4,local_44,pcVar3,moveto_mod,root_type);
            if (iVar2 == 0) {
              iVar2 = set_snode_insert_node(set,plVar4,LYXP_NODE_ELEM);
              if ((long)local_38 < (long)iVar2 && iVar2 < (int)local_40) {
                (set->val).nodes[iVar2].pos = 2;
                bVar1 = true;
              }
            }
          }
        }
        else {
          plVar4 = (lys_node *)(set->val).nodes[uVar5].node;
          if ((plVar4->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            last = (lys_node *)0x0;
            local_38 = uVar5;
            while (last = lys_getnext(last,plVar4,(lys_module *)0x0,0), uVar6 = local_38,
                  last != (lys_node *)0x0) {
              iVar2 = moveto_snode_check(last,local_44,pcVar3,moveto_mod,root_type);
              if (iVar2 == 0) {
                iVar2 = set_snode_insert_node(set,last,LYXP_NODE_ELEM);
                if ((long)local_38 < (long)iVar2 && iVar2 < (int)local_40) {
                  (set->val).nodes[iVar2].pos = 2;
                  bVar1 = true;
                }
              }
              plVar4 = (lys_node *)(set->val).nodes[uVar5].node;
            }
          }
        }
      }
      uVar5 = uVar6 + 1;
    }
    lydict_remove(ctx,pcVar3);
    if (bVar1) {
      iVar2 = 0;
      for (lVar7 = 0; uVar9 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 2) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 1;
        }
      }
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    pcVar3 = print_set_type(set);
    ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar3);
LAB_001679ee:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
moveto_snode(struct lyxp_set *set, struct lys_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    int i, orig_used, pref_len, idx, temp_ctx = 0;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    const struct lys_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, cur_node, 1);
        if (!moveto_mod) {
            LOGVAL(LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }
        set->val.snodes[i].in_ctx = 0;

        if ((set->val.snodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.snodes[i].type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, but we know it's moveto_mod (if set),
             * so use it directly (root node itself is useless in this case) */
            sub = NULL;
            while ((sub = lys_getnext(sub, NULL, (moveto_mod ? moveto_mod : lys_node_module(set->val.snodes[i].snode)), 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    /* we need to prevent these nodes to be considered in this moveto */
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }

        /* skip nodes without children - leaves, leaflists, and anyxmls (ouput root will eval to true) */
        } else if (!(set->val.snodes[i].snode->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            sub = NULL;
            while ((sub = lys_getnext(sub, set->val.snodes[i].snode, NULL, 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }
        }
    }
    lydict_remove(ctx, name_dict);

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.snodes[i].in_ctx == 2) {
                set->val.snodes[i].in_ctx = 1;
            }
        }
    }

    return EXIT_SUCCESS;
}